

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O0

void google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
               (char *data,int size,Operation op,string_view field_name)

{
  char *in_R9;
  string_view field_name_00;
  Operation op_local;
  int size_local;
  char *data_local;
  string_view field_name_local;
  
  field_name_00._M_len = field_name._M_str;
  field_name_00._M_str = in_R9;
  WireFormatLite::VerifyUtf8String
            ((WireFormatLite *)data,(char *)(ulong)(uint)size,op,(Operation)field_name._M_len,
             field_name_00);
  return;
}

Assistant:

inline void WireFormat::VerifyUTF8StringNamedField(
    const char* data, int size, WireFormat::Operation op,
    const absl::string_view field_name) {
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
  WireFormatLite::VerifyUtf8String(
      data, size, static_cast<WireFormatLite::Operation>(op), field_name);
#else
  // Avoid the compiler warning about unused variables.
  (void)data;
  (void)size;
  (void)op;
  (void)field_name;
#endif
}